

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

void libtorrent::merkle_validate_copy
               (span<const_libtorrent::digest32<256L>_> src,span<libtorrent::digest32<256L>_> dst,
               sha256_hash *root,bitfield *verified_leafs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  index_type iVar5;
  digest32<256L> *pdVar6;
  digest32<256L> *pdVar7;
  index_type iVar8;
  digest32<256L> *parent;
  int block_idx;
  int right_child;
  int left_child;
  int i;
  int leaf_layer_start;
  int num_leafs;
  bitfield *verified_leafs_local;
  sha256_hash *root_local;
  span<libtorrent::digest32<256L>_> dst_local;
  span<const_libtorrent::digest32<256L>_> src_local;
  
  dst_local.m_len = (difference_type)src.m_ptr;
  dst_local.m_ptr = (digest32<256L> *)dst.m_len;
  root_local = dst.m_ptr;
  iVar5 = span<libtorrent::digest32<256L>_>::size((span<libtorrent::digest32<256L>_> *)&root_local);
  bVar1 = span<const_libtorrent::digest32<256L>_>::empty
                    ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len);
  if (!bVar1) {
    pdVar6 = span<const_libtorrent::digest32<256L>_>::operator[]
                       ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,0);
    bVar1 = digest32<256L>::operator!=(pdVar6,root);
    if (!bVar1) {
      pdVar6 = span<const_libtorrent::digest32<256L>_>::operator[]
                         ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,0);
      pdVar7 = span<libtorrent::digest32<256L>_>::operator[]
                         ((span<libtorrent::digest32<256L>_> *)&root_local,0);
      *(undefined8 *)(pdVar7->m_number)._M_elems = *(undefined8 *)(pdVar6->m_number)._M_elems;
      *(undefined8 *)((pdVar7->m_number)._M_elems + 2) =
           *(undefined8 *)((pdVar6->m_number)._M_elems + 2);
      *(undefined8 *)((pdVar7->m_number)._M_elems + 4) =
           *(undefined8 *)((pdVar6->m_number)._M_elems + 4);
      *(undefined8 *)((pdVar7->m_number)._M_elems + 6) =
           *(undefined8 *)((pdVar6->m_number)._M_elems + 6);
      iVar8 = span<const_libtorrent::digest32<256L>_>::size
                        ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len);
      iVar2 = (int)iVar8 - (int)((iVar5 + 1) / 2);
      for (right_child = 0; right_child < iVar2; right_child = right_child + 1) {
        pdVar6 = span<libtorrent::digest32<256L>_>::operator[]
                           ((span<libtorrent::digest32<256L>_> *)&root_local,(long)right_child);
        bVar1 = digest32<256L>::is_all_zeros(pdVar6);
        if (!bVar1) {
          iVar3 = merkle_get_first_child(right_child);
          iVar4 = iVar3 + 1;
          pdVar6 = span<const_libtorrent::digest32<256L>_>::operator[]
                             ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,
                              (long)iVar3);
          pdVar7 = span<const_libtorrent::digest32<256L>_>::operator[]
                             ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,
                              (long)iVar4);
          parent = span<libtorrent::digest32<256L>_>::operator[]
                             ((span<libtorrent::digest32<256L>_> *)&root_local,(long)right_child);
          bVar1 = merkle_validate_node(pdVar6,pdVar7,parent);
          if (bVar1) {
            pdVar6 = span<const_libtorrent::digest32<256L>_>::operator[]
                               ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,
                                (long)iVar3);
            pdVar7 = span<libtorrent::digest32<256L>_>::operator[]
                               ((span<libtorrent::digest32<256L>_> *)&root_local,(long)iVar3);
            *(undefined8 *)(pdVar7->m_number)._M_elems = *(undefined8 *)(pdVar6->m_number)._M_elems;
            *(undefined8 *)((pdVar7->m_number)._M_elems + 2) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 2);
            *(undefined8 *)((pdVar7->m_number)._M_elems + 4) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 4);
            *(undefined8 *)((pdVar7->m_number)._M_elems + 6) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 6);
            pdVar6 = span<const_libtorrent::digest32<256L>_>::operator[]
                               ((span<const_libtorrent::digest32<256L>_> *)&dst_local.m_len,
                                (long)iVar4);
            pdVar7 = span<libtorrent::digest32<256L>_>::operator[]
                               ((span<libtorrent::digest32<256L>_> *)&root_local,(long)iVar4);
            *(undefined8 *)(pdVar7->m_number)._M_elems = *(undefined8 *)(pdVar6->m_number)._M_elems;
            *(undefined8 *)((pdVar7->m_number)._M_elems + 2) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 2);
            *(undefined8 *)((pdVar7->m_number)._M_elems + 4) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 4);
            *(undefined8 *)((pdVar7->m_number)._M_elems + 6) =
                 *(undefined8 *)((pdVar6->m_number)._M_elems + 6);
            iVar4 = iVar3 - iVar2;
            if ((iVar2 <= iVar3) && (iVar3 = bitfield::size(verified_leafs), iVar4 < iVar3)) {
              bitfield::set_bit(verified_leafs,iVar4);
              iVar3 = bitfield::size(verified_leafs);
              if (iVar4 + 1 < iVar3) {
                bitfield::set_bit(verified_leafs,iVar4 + 1);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void merkle_validate_copy(span<sha256_hash const> const src
		, span<sha256_hash> const dst, sha256_hash const& root
		, bitfield& verified_leafs)
	{
		TORRENT_ASSERT(src.size() == dst.size());
		int const num_leafs = int((dst.size() + 1) / 2);
		if (src.empty()) return;
		if (src[0] != root) return;
		dst[0] = src[0];
		int const leaf_layer_start = int(src.size() - num_leafs);
		for (int i = 0; i < leaf_layer_start; ++i)
		{
			if (dst[i].is_all_zeros()) continue;
			int const left_child = merkle_get_first_child(i);
			int const right_child = left_child + 1;
			if (merkle_validate_node(src[left_child], src[right_child], dst[i]))
			{
				dst[left_child] = src[left_child];
				dst[right_child] = src[right_child];
				int const block_idx = left_child - leaf_layer_start;
				if (left_child >= leaf_layer_start
					&& block_idx < verified_leafs.size())
				{
					verified_leafs.set_bit(block_idx);
					// the right child may be the first block of padding hash,
					// in which case it's not part of the verified bitfield
					if (block_idx + 1 < verified_leafs.size())
						verified_leafs.set_bit(block_idx + 1);
				}
			}
		}
	}